

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O0

vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> * __thiscall
banksia::TourMng::getKnockoutWinnerList(TourMng *this)

{
  bool bVar1;
  __type _Var2;
  TourMng *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int winIdx_1;
  TourPlayerPair thePair_1;
  pair<const_int,_banksia::TourPlayerPair> *p;
  iterator __end1_1;
  iterator __begin1_1;
  map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
  *__range1_1;
  int whiteSd;
  int winIdx;
  int idxW;
  iterator it;
  TourPlayerPair thePair;
  MatchRecord *r;
  iterator __end1;
  iterator __begin1;
  vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_> *__range1;
  map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
  pairMap;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nameList;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lostSet;
  int lastRound;
  vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *winList;
  mapped_type *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  uint in_stack_fffffffffffffd94;
  iterator in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  TourPlayerPair *in_stack_fffffffffffffdc8;
  TourPlayerPair *in_stack_fffffffffffffdd0;
  _Self local_198;
  _Self local_190;
  undefined1 *local_188;
  uint local_17c;
  uint local_178;
  uint local_174;
  _Self local_170;
  _Self local_168 [2];
  string local_158 [36];
  int aiStack_134 [7];
  string asStack_118 [16];
  string local_108 [72];
  reference local_c0;
  MatchRecord *local_b8;
  __normal_iterator<banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
  local_b0;
  vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_> *local_a8;
  undefined1 local_a0 [136];
  int local_18;
  byte local_11;
  
  local_11 = 0;
  __rhs = in_RDI;
  std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::vector
            ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)0x19a35e);
  local_18 = getLastRound(in_RSI);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x19a386);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x19a393);
  std::
  map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
  ::map((map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
         *)0x19a3a0);
  local_a8 = &in_RSI->matchRecordList;
  local_b0._M_current =
       (MatchRecord *)
       std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>::begin
                 ((vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_> *)
                  in_stack_fffffffffffffd88);
  local_b8 = (MatchRecord *)
             std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>::end
                       ((vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_> *)
                        in_stack_fffffffffffffd88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                            (__normal_iterator<banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
                             *)in_stack_fffffffffffffd88), bVar1) {
    local_c0 = __gnu_cxx::
               __normal_iterator<banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
               ::operator*(&local_b0);
    if (local_c0->round == local_18) {
      TourPlayerPair::TourPlayerPair((TourPlayerPair *)in_RDI);
      in_stack_fffffffffffffd98 =
           std::
           map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
           ::find((map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
                   *)in_stack_fffffffffffffd88,(key_type *)0x19a46e);
      local_168[0]._M_node = in_stack_fffffffffffffd98._M_node;
      local_170._M_node =
           (_Base_ptr)
           std::
           map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
           ::end((map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
                  *)in_stack_fffffffffffffd88);
      bVar1 = std::operator!=(local_168,&local_170);
      if (bVar1) {
        std::_Rb_tree_iterator<std::pair<const_int,_banksia::TourPlayerPair>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_int,_banksia::TourPlayerPair>_> *)0x19a4bf);
        TourPlayerPair::operator=
                  ((TourPlayerPair *)in_RDI,(TourPlayerPair *)in_stack_fffffffffffffd98._M_node);
      }
      else {
        std::__cxx11::string::operator=(local_158,(string *)local_c0->playernames);
        std::__cxx11::string::operator=(local_108,(string *)(local_c0->playernames + 1));
      }
      if (((local_c0->result).result == win) || ((local_c0->result).result == loss)) {
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_RSI,__rhs);
        local_174 = (uint)_Var2;
        in_stack_fffffffffffffd94 = local_174;
        if ((local_c0->result).result != win) {
          in_stack_fffffffffffffd94 = 1 - local_174;
        }
        aiStack_134[(long)(int)in_stack_fffffffffffffd94 * 0x14] =
             aiStack_134[(long)(int)in_stack_fffffffffffffd94 * 0x14] + 1;
        local_178 = in_stack_fffffffffffffd94;
      }
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_RSI,__rhs);
      local_17c = (uint)_Var2;
      *(int *)(local_108 + (long)(int)local_17c * 0x50 + -0x10) =
           *(int *)(local_108 + (long)(int)local_17c * 0x50 + -0x10) + 1;
      in_stack_fffffffffffffd88 =
           std::
           map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
           ::operator[]((map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
                         *)in_stack_fffffffffffffdd0,(key_type *)in_stack_fffffffffffffdc8);
      TourPlayerPair::operator=
                ((TourPlayerPair *)in_RDI,(TourPlayerPair *)in_stack_fffffffffffffd98._M_node);
      TourPlayerPair::~TourPlayerPair((TourPlayerPair *)in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<banksia::MatchRecord_*,_std::vector<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>_>
    ::operator++(&local_b0);
  }
  local_188 = local_a0;
  local_190._M_node =
       (_Base_ptr)
       std::
       map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
       ::begin((map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
                *)in_stack_fffffffffffffd88);
  local_198._M_node =
       (_Base_ptr)
       std::
       map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
       ::end((map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
              *)in_stack_fffffffffffffd88);
  while (bVar1 = std::operator!=(&local_190,&local_198), bVar1) {
    std::_Rb_tree_iterator<std::pair<const_int,_banksia::TourPlayerPair>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_int,_banksia::TourPlayerPair>_> *)0x19a6eb);
    TourPlayerPair::TourPlayerPair(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::push_back
              ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)in_RDI,
               (value_type *)in_stack_fffffffffffffd98._M_node);
    TourPlayerPair::~TourPlayerPair((TourPlayerPair *)in_RDI);
    std::_Rb_tree_iterator<std::pair<const_int,_banksia::TourPlayerPair>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_banksia::TourPlayerPair>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  }
  local_11 = 1;
  std::
  map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
  ::~map((map<int,_banksia::TourPlayerPair,_std::less<int>,_std::allocator<std::pair<const_int,_banksia::TourPlayerPair>_>_>
          *)0x19a7cf);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDI);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x19a7e9);
  if ((local_11 & 1) == 0) {
    std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::~vector
              ((vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)in_RDI);
  }
  return (vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *)__rhs;
}

Assistant:

std::vector<TourPlayer> TourMng::getKnockoutWinnerList()
{
    std::vector<TourPlayer> winList;
    auto lastRound = getLastRound();
    
    std::set<std::string> lostSet;
    std::vector<std::string> nameList;
    std::map<int, TourPlayerPair> pairMap;
    
    for(auto && r : matchRecordList) {
        if (r.round != lastRound) {
            continue;
        }
        
        assert(r.state == MatchState::completed);
        TourPlayerPair thePair;
        auto it = pairMap.find(r.pairId);
        if (it != pairMap.end()) thePair = it->second;
        else {
            thePair.pair[0].name = r.playernames[0];
            thePair.pair[1].name = r.playernames[1];
        }
        
        if (r.result.result == ResultType::win || r.result.result == ResultType::loss) {
            auto idxW = thePair.pair[W].name == r.playernames[W] ? W : B;
            auto winIdx = r.result.result == ResultType::win ? idxW : (1 - idxW);
            thePair.pair[winIdx].winCnt++;
        }
        auto whiteSd = thePair.pair[W].name == r.playernames[W] ? W : B;
        thePair.pair[whiteSd].whiteCnt++;
        pairMap[r.pairId] = thePair;
    }
    
    for(auto && p : pairMap) {
        auto thePair = p.second;
        assert(thePair.pair[0].winCnt != thePair.pair[1].winCnt || thePair.pair[0].whiteCnt != thePair.pair[1].whiteCnt);
        auto winIdx = W;
        if (thePair.pair[B].winCnt > thePair.pair[W].winCnt ||
            (thePair.pair[B].winCnt == thePair.pair[W].winCnt && thePair.pair[B].whiteCnt < thePair.pair[W].whiteCnt)) {
            winIdx = B;
        }
        winList.push_back(thePair.pair[winIdx]);
    }
    
    return winList;
}